

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F3DAudio.c
# Opt level: O3

uint32_t F3DAudioInitialize8(uint32_t SpeakerChannelMask,float SpeedOfSound,uint8_t *Instance)

{
  int iVar1;
  
  *(uint32_t *)Instance = SpeakerChannelMask;
  *(float *)(Instance + 0xc) = SpeedOfSound;
  *(int *)(Instance + 0x10) = (int)SpeedOfSound + -1;
  Instance[8] = 0xff;
  Instance[9] = 0xff;
  Instance[10] = 0xff;
  Instance[0xb] = 0xff;
  if ((SpeakerChannelMask & 8) == 0) {
    if (SpeakerChannelMask == 0) {
      iVar1 = 0;
      goto LAB_00108dcc;
    }
  }
  else {
    *(uint *)(Instance + 8) = 3 - (uint)((SpeakerChannelMask & 4) == 0);
  }
  iVar1 = 0;
  do {
    iVar1 = iVar1 + 1;
    SpeakerChannelMask = SpeakerChannelMask - 1 & SpeakerChannelMask;
  } while (SpeakerChannelMask != 0);
LAB_00108dcc:
  *(int *)(Instance + 4) = iVar1;
  return 0;
}

Assistant:

uint32_t F3DAudioInitialize8(
	uint32_t SpeakerChannelMask,
	float SpeedOfSound,
	F3DAUDIO_HANDLE Instance
) {
	union
	{
		float f;
		uint32_t i;
	} epsilonHack;
	uint32_t speakerCount = 0;

	if (!F3DAudioCheckInitParams(SpeakerChannelMask, SpeedOfSound, Instance))
	{
		return FAUDIO_E_INVALID_CALL;
	}

	SPEAKERMASK(Instance) = SpeakerChannelMask;
	SPEEDOFSOUND(Instance) = SpeedOfSound;

	/* "Convert" raw float to int... */
	epsilonHack.f = SpeedOfSound;
	/* ... Subtract epsilon value... */
	epsilonHack.i -= 1;
	/* ... Convert back to float. */
	SPEEDOFSOUNDEPSILON(Instance) = epsilonHack.f;

	SPEAKER_LF_INDEX(Instance) = 0xFFFFFFFF;
	if (SpeakerChannelMask & SPEAKER_LOW_FREQUENCY)
	{
		if (SpeakerChannelMask & SPEAKER_FRONT_CENTER)
		{
			SPEAKER_LF_INDEX(Instance) = 3;
		}
		else
		{
			SPEAKER_LF_INDEX(Instance) = 2;
		}
	}

	while (SpeakerChannelMask)
	{
		speakerCount += 1;
		SpeakerChannelMask &= SpeakerChannelMask - 1;
	}
	SPEAKERCOUNT(Instance) = speakerCount;

	return 0;
}